

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O2

bool __thiscall ElfFile::load(ElfFile *this,ByteArray *data,bool sort)

{
  ByteArray *this_00;
  pointer ppEVar1;
  Elf32_Shdr header;
  bool bVar2;
  ElfSegment *pEVar3;
  ElfSection *this_01;
  uint uVar4;
  ElfSection **ppEVar5;
  uint uVar6;
  ulong uVar7;
  int k;
  long lVar8;
  int i;
  long lVar9;
  ByteArray segmentData;
  ElfSegment *segment;
  Elf32_Phdr sectionHeader;
  Elf32_Shdr local_58;
  
  this_00 = &this->fileData;
  ByteArray::operator=(this_00,data);
  loadElfHeader(this);
  this->symTab = (ElfSection *)0x0;
  this->strTab = (ElfSection *)0x0;
  for (uVar7 = 0; uVar7 < (this->fileHeader).e_phnum; uVar7 = uVar7 + 1) {
    loadProgramHeader(this,&sectionHeader,this_00,
                      (this->fileHeader).e_phentsize * uVar7 + (ulong)(this->fileHeader).e_phoff);
    ByteArray::mid(&segmentData,this_00,(ulong)sectionHeader.p_offset,(ulong)sectionHeader.p_filesz)
    ;
    pEVar3 = (ElfSegment *)operator_new(0x58);
    (pEVar3->header).p_filesz = sectionHeader.p_filesz;
    (pEVar3->header).p_memsz = sectionHeader.p_memsz;
    (pEVar3->header).p_flags = sectionHeader.p_flags;
    (pEVar3->header).p_align = sectionHeader.p_align;
    (pEVar3->header).p_type = sectionHeader.p_type;
    (pEVar3->header).p_offset = sectionHeader.p_offset;
    (pEVar3->header).p_vaddr = sectionHeader.p_vaddr;
    (pEVar3->header).p_paddr = sectionHeader.p_paddr;
    ByteArray::ByteArray(&pEVar3->data,&segmentData);
    (pEVar3->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pEVar3->paddrSection = (ElfSection *)0x0;
    (pEVar3->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pEVar3->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    segment = pEVar3;
    std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::push_back(&this->segments,&segment);
    ByteArray::~ByteArray(&segmentData);
  }
  uVar6 = 0;
  do {
    if ((this->fileHeader).e_shnum <= uVar6) {
      determinePartOrder(this);
      loadSectionNames(this);
      if (sort) {
        std::
        __sort<__gnu_cxx::__normal_iterator<ElfSection**,std::vector<ElfSection*,std::allocator<ElfSection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ElfSection*,ElfSection*)>>
                  ((__normal_iterator<ElfSection_**,_std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>_>
                    )(this->segmentlessSections).
                     super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<ElfSection_**,_std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>_>
                    )(this->segmentlessSections).
                     super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<bool_(*)(ElfSection_*,_ElfSection_*)>)0x165e60);
        for (lVar9 = 0;
            ppEVar1 = (this->segments).
                      super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
            lVar9 < (int)((ulong)((long)(this->segments).
                                        super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1)
                         >> 3); lVar9 = lVar9 + 1) {
          ElfSegment::sortSections(ppEVar1[lVar9]);
        }
      }
      return true;
    }
    loadSectionHeader(this,&local_58,this_00,
                      (ulong)((this->fileHeader).e_shentsize * uVar6 + (this->fileHeader).e_shoff));
    this_01 = (ElfSection *)operator_new(0x68);
    header.sh_flags = local_58.sh_flags;
    header.sh_addr = local_58.sh_addr;
    header.sh_name = local_58.sh_name;
    header.sh_type = local_58.sh_type;
    header.sh_offset = local_58.sh_offset;
    header.sh_size = local_58.sh_size;
    header.sh_link = local_58.sh_link;
    header.sh_info = local_58.sh_info;
    header.sh_addralign = local_58.sh_addralign;
    header.sh_entsize = local_58.sh_entsize;
    ElfSection::ElfSection(this_01,header);
    segmentData.data_ = (byte *)this_01;
    std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::push_back
              (&this->sections,(value_type *)&segmentData);
    lVar9 = 0;
    do {
      lVar8 = lVar9;
      ppEVar1 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->segments).
                              super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3) <=
          lVar8) goto LAB_00166b98;
      bVar2 = ElfSegment::isSectionPartOf(ppEVar1[lVar8],(ElfSection *)segmentData.data_);
      lVar9 = lVar8 + 1;
    } while (!bVar2);
    pEVar3 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar8];
    if (pEVar3 == (ElfSegment *)0x0) {
LAB_00166b98:
      uVar4 = *(uint *)(segmentData.data_ + 4);
      if ((uVar4 & 0xfffffff7) != 0) {
        ByteArray::mid((ByteArray *)&sectionHeader,this_00,
                       (ulong)*(uint *)(segmentData.data_ + 0x10),
                       (ulong)*(uint *)(segmentData.data_ + 0x14));
        ByteArray::operator=((ByteArray *)(segmentData.data_ + 0x48),(ByteArray *)&sectionHeader);
        ByteArray::~ByteArray((ByteArray *)&sectionHeader);
        uVar4 = *(uint *)(segmentData.data_ + 4);
      }
      ppEVar5 = &this->symTab;
      if ((uVar4 == 2) ||
         ((uVar4 == 3 &&
          ((ppEVar5 = &this->strTab, this->strTab == (ElfSection *)0x0 ||
           (uVar6 != (this->fileHeader).e_shstrndx)))))) {
        *ppEVar5 = (ElfSection *)segmentData.data_;
      }
      std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::push_back
                (&this->segmentlessSections,(value_type *)&segmentData);
    }
    else {
      ElfSegment::addSection(pEVar3,(ElfSection *)segmentData.data_);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool ElfFile::load(ByteArray& data, bool sort)
{
	fileData = data;

	loadElfHeader();
	symTab = nullptr;
	strTab = nullptr;

	// load segments
	for (size_t i = 0; i < fileHeader.e_phnum; i++)
	{
		size_t pos = fileHeader.e_phoff+i*fileHeader.e_phentsize;
		
		Elf32_Phdr sectionHeader;
		loadProgramHeader(sectionHeader, fileData, pos);

		ByteArray segmentData = fileData.mid(sectionHeader.p_offset,sectionHeader.p_filesz);
		ElfSegment* segment = new ElfSegment(sectionHeader,segmentData);
		segments.push_back(segment);
	}
	
	// load sections and assign them to segments
	for (int i = 0; i < fileHeader.e_shnum; i++)
	{
		size_t pos = fileHeader.e_shoff+i*fileHeader.e_shentsize;

		Elf32_Shdr sectionHeader;
		loadSectionHeader(sectionHeader, fileData, pos);

		ElfSection* section = new ElfSection(sectionHeader);
		sections.push_back(section);

		// check if the section belongs to a segment
		ElfSegment* owner = nullptr;
		for (int k = 0; k < (int)segments.size(); k++)
		{
			if (segments[k]->isSectionPartOf(section))
			{
				owner = segments[k];
				break;
			}
		}

		if (owner != nullptr)
		{
			owner->addSection(section);
		} else {
			if (section->getType() != SHT_NOBITS && section->getType() != SHT_NULL)
			{
				ByteArray data = fileData.mid(section->getOffset(),section->getSize());
				section->setData(data);
			}

			switch (section->getType())
			{
			case SHT_SYMTAB:
				symTab = section;
				break;
			case SHT_STRTAB:
				if (!strTab || i != fileHeader.e_shstrndx)
				{
					strTab = section;
				}
				break;
			}

			segmentlessSections.push_back(section);
		}
	}
	
	determinePartOrder();
	loadSectionNames();

	if (sort)
	{
		std::sort(segmentlessSections.begin(),segmentlessSections.end(),compareSection);

		for (int i = 0; i < (int)segments.size(); i++)
		{
			segments[i]->sortSections();
		}
	}

	return true;
}